

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo.cpp
# Opt level: O2

DBaseStatusBar * CreateCustomStatusBar(int script)

{
  DSBarInfo *this;
  
  if (SBarInfoScript[script] == (SBarInfo *)0x0) {
    I_FatalError("Tried to create a status bar with no script!");
  }
  this = (DSBarInfo *)DObject::operator_new(0xe8);
  DSBarInfo::DSBarInfo(this,SBarInfoScript[script]);
  return &this->super_DBaseStatusBar;
}

Assistant:

DBaseStatusBar *CreateCustomStatusBar (int script)
{
	if(SBarInfoScript[script] == NULL)
		I_FatalError("Tried to create a status bar with no script!");
	return new DSBarInfo(SBarInfoScript[script]);
}